

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

RealType __thiscall
OpenMD::EAM::getSuggestedCutoffRadius(EAM *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  double dVar1;
  pointer piVar2;
  pointer pEVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  int iVar9;
  int iVar10;
  long lVar11;
  double local_38;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar9 = AtomType::getIdent(atypes.first);
  iVar10 = AtomType::getIdent(atypes.second);
  piVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)piVar2[iVar9];
  iVar9 = piVar2[iVar10];
  if (lVar11 == -1) {
    local_38 = 0.0;
  }
  else {
    pEVar3 = (this->EAMdata).
             super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = pEVar3[lVar11].rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    p_Var5 = pEVar3[lVar11].F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    p_Var6 = pEVar3[lVar11].Z.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    p_Var7 = pEVar3[lVar11].phiCC.
             super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    p_Var8 = pEVar3[lVar11].phiCV.
             super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    local_38 = pEVar3[lVar11].rcut;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  if (iVar9 != -1) {
    pEVar3 = (this->EAMdata).
             super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = pEVar3[iVar9].rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    p_Var5 = pEVar3[iVar9].F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    p_Var6 = pEVar3[iVar9].Z.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    p_Var7 = pEVar3[iVar9].phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    p_Var8 = pEVar3[iVar9].phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    dVar1 = pEVar3[iVar9].rcut;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if (dVar1 <= local_38) {
      dVar1 = local_38;
    }
    local_38 = dVar1;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  return local_38;
}

Assistant:

RealType EAM::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    RealType cut = 0.0;

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int eamtid1 = EAMtids[atid1];
    int eamtid2 = EAMtids[atid2];

    if (eamtid1 != -1) {
      EAMAtomData data1 = EAMdata[eamtid1];
      cut               = data1.rcut;
    }

    if (eamtid2 != -1) {
      EAMAtomData data2 = EAMdata[eamtid2];
      if (data2.rcut > cut) cut = data2.rcut;
    }

    return cut;
  }